

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super.c
# Opt level: O0

int Super_CommandSupergates(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  FILE *__stream_00;
  Mio_Library_t *pLib_00;
  char *pcVar3;
  float fVar4;
  double dVar5;
  uint local_7c;
  int c;
  int fVerbose;
  int TimeLimit;
  int nGatesMax;
  int nLevels;
  int nVarsMax;
  int fWriteOldFormat;
  int fSkipInvs;
  float AreaLimit;
  float DelayLimit;
  char *ExcludeFile;
  char *FileName;
  Mio_Library_t *pLib;
  FILE *pErr;
  FILE *pOut;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  nGatesMax = 5;
  TimeLimit = 2;
  fSkipInvs = 0;
  fWriteOldFormat = 0;
  fVerbose = 0;
  c = 0;
  nVarsMax = 1;
  local_7c = 0;
  bVar1 = false;
  _AreaLimit = (char *)0x0;
  Extra_UtilGetoptReset();
LAB_0048cf10:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"ILNTDAEsovh");
    if (iVar2 == -1) {
      if (argc == globalUtilOptind + 1) {
        if ((nGatesMax < 2) || (6 < nGatesMax)) {
          fprintf(__stream,
                  "The max number of variables (%d) should be more than 1 and less than 7.\n",
                  (ulong)(uint)nGatesMax);
        }
        else {
          pcVar3 = argv[globalUtilOptind];
          __stream_00 = (FILE *)Io_FileOpen(pcVar3,"open_path","r",0);
          if (__stream_00 == (FILE *)0x0) {
            fprintf(__stream,"Cannot open input file \"%s\". ",pcVar3);
            pcVar3 = Extra_FileGetSimilarName(pcVar3,".genlib",".lib",".gen",".g",(char *)0x0);
            if (pcVar3 != (char *)0x0) {
              fprintf(__stream,"Did you mean \"%s\"?",pcVar3);
            }
            fprintf(__stream,"\n");
            return 1;
          }
          fclose(__stream_00);
          pLib_00 = Mio_LibraryRead(pcVar3,(char *)0x0,_AreaLimit,local_7c);
          if (pLib_00 != (Mio_Library_t *)0x0) {
            pcVar3 = Mio_LibraryReadName(pLib_00);
            pcVar3 = Extra_FileNameGenericAppend(pcVar3,".super");
            Super_Precompute(pLib_00,nGatesMax,TimeLimit,fVerbose,(float)fSkipInvs,
                             (float)fWriteOldFormat,c,nVarsMax,local_7c,pcVar3);
            Mio_LibraryDelete(pLib_00);
            return 0;
          }
          fprintf(__stream,"Reading library has failed.\n");
        }
      }
      else {
        fprintf(__stream,"The genlib library file should be given on the command line.\n");
      }
      goto LAB_0048d305;
    }
    switch(iVar2) {
    case 0x41:
      dVar5 = atof(argv[globalUtilOptind]);
      fWriteOldFormat = (int)(float)dVar5;
      fVar4 = (float)fWriteOldFormat;
      goto joined_r0x0048d099;
    default:
      goto LAB_0048d305;
    case 0x44:
      dVar5 = atof(argv[globalUtilOptind]);
      fSkipInvs = (int)(float)dVar5;
      fVar4 = (float)fSkipInvs;
joined_r0x0048d099:
      globalUtilOptind = globalUtilOptind + 1;
      if (fVar4 <= 0.0) goto LAB_0048d305;
      goto LAB_0048cf10;
    case 0x45:
      _AreaLimit = argv[globalUtilOptind];
      if (_AreaLimit == (char *)0x0) goto LAB_0048d305;
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0048cf10;
    case 0x49:
      nGatesMax = atoi(argv[globalUtilOptind]);
      iVar2 = nGatesMax;
      break;
    case 0x4c:
      TimeLimit = atoi(argv[globalUtilOptind]);
      iVar2 = TimeLimit;
      break;
    case 0x4e:
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar2 = fVerbose;
      break;
    case 0x54:
      c = atoi(argv[globalUtilOptind]);
      iVar2 = c;
      break;
    case 0x68:
      goto LAB_0048d305;
    case 0x6f:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0048cf10;
    case 0x73:
      nVarsMax = nVarsMax ^ 1;
      goto LAB_0048cf10;
    case 0x76:
      local_7c = local_7c ^ 1;
      goto LAB_0048cf10;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0048d305:
      fprintf(__stream,"usage: super [-ILNT num] [-DA float] [-E file] [-sovh] <genlib_file>\n");
      fprintf(__stream,"\t         precomputes the supergates for the given genlib library\n");
      fprintf(__stream,"\t-I num   : the max number of supergate inputs [default = %d]\n",
              (ulong)(uint)nGatesMax);
      fprintf(__stream,"\t-L num   : the max number of levels of gates [default = %d]\n",
              (ulong)(uint)TimeLimit);
      fprintf(__stream,
              "\t-N num   : the limit on the number of considered supergates [default = %d]\n",
              (ulong)(uint)fVerbose);
      fprintf(__stream,"\t-T num   : the approximate runtime limit in seconds [default = %d]\n",
              (ulong)(uint)c);
      fprintf(__stream,"\t-D float : the max delay of the supergates [default = %.2f]\n",
              (double)(float)fSkipInvs);
      fprintf(__stream,"\t-A float : the max area of the supergates [default = %.2f]\n",
              (double)(float)fWriteOldFormat);
      fprintf(__stream,"\t-E file  : file contains list of genlib gates to exclude\n");
      pcVar3 = "yes";
      if (nVarsMax != 0) {
        pcVar3 = "no";
      }
      fprintf(__stream,"\t-s       : toggle the use of inverters at the inputs [default = %s]\n",
              pcVar3);
      pcVar3 = "no";
      if (bVar1) {
        pcVar3 = "yes";
      }
      fprintf(__stream,
              "\t-o       : toggle dumping the supergate library in old format [default = %s]\n",
              pcVar3);
      pcVar3 = "no";
      if (local_7c != 0) {
        pcVar3 = "yes";
      }
      fprintf(__stream,"\t-v       : enable verbose output [default = %s]\n",pcVar3);
      fprintf(__stream,"\t-h       : print the help message\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"\tHere is a piece of advice on precomputing supergate libraries:\n");
      fprintf(__stream,"\t\n");
      fprintf(__stream,"\tStart with the number of inputs equal to 5 (-I 5), the number of \n");
      fprintf(__stream,"\tlevels equal to 2 (-L 2), the delay equal to 2-3 delays of inverter, \n");
      fprintf(__stream,"\tthe area equal to 2-3 areas of two input NAND, and runtime limit equal \n"
             );
      fprintf(__stream,"\tto 10 seconds (-T 10). Run precomputation and learn from the result.\n");
      fprintf(__stream,"\tDetermine what parameter is most constraining and try to increase \n");
      fprintf(__stream,"\tthe value of that parameter. The goal is to have a well-balanced\n");
      fprintf(__stream,"\tset of constraints and the resulting supergate library containing\n");
      fprintf(__stream,"\tapproximately 5K-20K supergates. Typically, it is better to increase\n");
      fprintf(__stream,
              "\tdelay limit rather than area limit, because having large-area supergates\n");
      fprintf(__stream,"\tmay result in a considerable increase in area.\n");
      fprintf(__stream,"\t\n");
      fprintf(__stream,"\tNote that a good supergate library for experiments typically can be \n");
      fprintf(__stream,
              "\tprecomputed in 30 sec or less. Increasing runtime limit makes sense when\n");
      fprintf(__stream,"\tother parameters are well-balanced and it is needed to enumerate more\n");
      fprintf(__stream,"\tchoices to have a good result. In the end, to compute the final library\n"
             );
      fprintf(__stream,"\tthe runtime can be set to 300 sec to ensure the ultimate quality.\n");
      fprintf(__stream,"\tIn some cases, the runtime has to be reduced if the supergate library\n");
      fprintf(__stream,"\tcontains too many supergates (> 500K).\n");
      fprintf(__stream,"\t\n");
      fprintf(__stream,"\tWhen precomputing libraries of 6 inputs (-i 6), start with even more \n");
      fprintf(__stream,
              "\trestricted parameters and gradually increase them until the goal is met.\n");
      fprintf(__stream,"\t\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Super_CommandSupergates( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Mio_Library_t * pLib;
    char * FileName, * ExcludeFile;
    float DelayLimit;
    float AreaLimit;
    int fSkipInvs;
    int fWriteOldFormat; 
    int nVarsMax, nLevels, nGatesMax, TimeLimit;
    int fVerbose;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    nVarsMax   = 5;
    nLevels    = 2;
    DelayLimit = 0;
    AreaLimit  = 0;
    nGatesMax  = 0;
    TimeLimit  = 0;
    fSkipInvs  = 1;
    fVerbose   = 0;
    fWriteOldFormat = 0;
    ExcludeFile = 0;

    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "ILNTDAEsovh")) != EOF ) 
    {
        switch (c) 
        {
            case 'I':
                nVarsMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nVarsMax < 0 ) 
                    goto usage;
                break;
            case 'L':
                nLevels = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nLevels < 0 ) 
                    goto usage;
                break;
            case 'N':
                nGatesMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nGatesMax < 0 ) 
                    goto usage;
                break;
            case 'T':
                TimeLimit = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( TimeLimit < 0 ) 
                    goto usage;
                break;
            case 'D':
                DelayLimit = (float)atof(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( DelayLimit <= 0.0 ) 
                    goto usage;
                break;
            case 'A':
                AreaLimit = (float)atof(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( AreaLimit <= 0.0 ) 
                    goto usage;
                break;
            case 'E':
                ExcludeFile = argv[globalUtilOptind];
                if ( ExcludeFile == 0 )
                    goto usage;
                globalUtilOptind++;
                break;
            case 's':
                fSkipInvs ^= 1;
                break;
            case 'o':
                fWriteOldFormat ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }


    if ( argc != globalUtilOptind + 1 )
    {
        fprintf( pErr, "The genlib library file should be given on the command line.\n" );
        goto usage;
    }

    if ( nVarsMax < 2 || nVarsMax > 6 )
    {
        fprintf( pErr, "The max number of variables (%d) should be more than 1 and less than 7.\n", nVarsMax );
        goto usage;
    }

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( FileName, "open_path", "r", 0 )) == NULL )
//    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", FileName );
        if (( FileName = Extra_FileGetSimilarName( FileName, ".genlib", ".lib", ".gen", ".g", NULL ) ))
            fprintf( pErr, "Did you mean \"%s\"?", FileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pLib = Mio_LibraryRead( FileName, NULL, ExcludeFile, fVerbose );
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading library has failed.\n" );
        goto usage;
    }

    // compute the gates
    FileName = Extra_FileNameGenericAppend(Mio_LibraryReadName(pLib), ".super");
    Super_Precompute( pLib, nVarsMax, nLevels, nGatesMax, DelayLimit, AreaLimit, TimeLimit, fSkipInvs, fVerbose, FileName );

    // delete the library
    Mio_LibraryDelete( pLib );
    return 0;

usage:
    fprintf( pErr, "usage: super [-ILNT num] [-DA float] [-E file] [-sovh] <genlib_file>\n");
    fprintf( pErr, "\t         precomputes the supergates for the given genlib library\n" );  
    fprintf( pErr, "\t-I num   : the max number of supergate inputs [default = %d]\n", nVarsMax );
    fprintf( pErr, "\t-L num   : the max number of levels of gates [default = %d]\n", nLevels );
    fprintf( pErr, "\t-N num   : the limit on the number of considered supergates [default = %d]\n", nGatesMax );
    fprintf( pErr, "\t-T num   : the approximate runtime limit in seconds [default = %d]\n", TimeLimit );
    fprintf( pErr, "\t-D float : the max delay of the supergates [default = %.2f]\n", DelayLimit );
    fprintf( pErr, "\t-A float : the max area of the supergates [default = %.2f]\n", AreaLimit );
    fprintf( pErr, "\t-E file  : file contains list of genlib gates to exclude\n" );
    fprintf( pErr, "\t-s       : toggle the use of inverters at the inputs [default = %s]\n", (fSkipInvs? "no": "yes") );
    fprintf( pErr, "\t-o       : toggle dumping the supergate library in old format [default = %s]\n", (fWriteOldFormat? "yes": "no") );
    fprintf( pErr, "\t-v       : enable verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h       : print the help message\n");
    fprintf( pErr, "\n");
    fprintf( pErr, "\tHere is a piece of advice on precomputing supergate libraries:\n");
    fprintf( pErr, "\t\n");
    fprintf( pErr, "\tStart with the number of inputs equal to 5 (-I 5), the number of \n");
    fprintf( pErr, "\tlevels equal to 2 (-L 2), the delay equal to 2-3 delays of inverter, \n");
    fprintf( pErr, "\tthe area equal to 2-3 areas of two input NAND, and runtime limit equal \n");
    fprintf( pErr, "\tto 10 seconds (-T 10). Run precomputation and learn from the result.\n");
    fprintf( pErr, "\tDetermine what parameter is most constraining and try to increase \n");
    fprintf( pErr, "\tthe value of that parameter. The goal is to have a well-balanced\n");
    fprintf( pErr, "\tset of constraints and the resulting supergate library containing\n");
    fprintf( pErr, "\tapproximately 5K-20K supergates. Typically, it is better to increase\n");
    fprintf( pErr, "\tdelay limit rather than area limit, because having large-area supergates\n");
    fprintf( pErr, "\tmay result in a considerable increase in area.\n");
    fprintf( pErr, "\t\n");
    fprintf( pErr, "\tNote that a good supergate library for experiments typically can be \n");
    fprintf( pErr, "\tprecomputed in 30 sec or less. Increasing runtime limit makes sense when\n");
    fprintf( pErr, "\tother parameters are well-balanced and it is needed to enumerate more\n");
    fprintf( pErr, "\tchoices to have a good result. In the end, to compute the final library\n");
    fprintf( pErr, "\tthe runtime can be set to 300 sec to ensure the ultimate quality.\n");
    fprintf( pErr, "\tIn some cases, the runtime has to be reduced if the supergate library\n");
    fprintf( pErr, "\tcontains too many supergates (> 500K).\n");
    fprintf( pErr, "\t\n");
    fprintf( pErr, "\tWhen precomputing libraries of 6 inputs (-i 6), start with even more \n");
    fprintf( pErr, "\trestricted parameters and gradually increase them until the goal is met.\n");
    fprintf( pErr, "\t\n");
    return 1;       /* error exit */
}